

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O0

void __thiscall
CommandDrawGem::Draw(CommandDrawGem *this,SBarInfoMainBlock *block,DSBarInfo *statusBar)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int yOffset;
  FTexture *pFVar4;
  double dVar5;
  SBarInfoCoordinate local_54;
  SBarInfoCoordinate local_50;
  SBarInfoCoordinate local_4c;
  SBarInfoCoordinate local_48;
  uint local_44;
  int local_40;
  int offset;
  int chainWidth;
  SBarInfoCoordinate drawY;
  FTexture *gemImg;
  FTexture *chainImg;
  DSBarInfo *statusBar_local;
  SBarInfoMainBlock *block_local;
  CommandDrawGem *this_local;
  
  pFVar4 = FImageCollection::operator[](&statusBar->Images,this->chain);
  _chainWidth = FImageCollection::operator[](&statusBar->Images,this->gem);
  if (pFVar4 != (FTexture *)0x0) {
    offset = *(int *)&this->y;
    if (((this->wiggle & 1U) != 0) && (this->drawValue != this->goalValue)) {
      SBarInfoCoordinate::operator+=((SBarInfoCoordinate *)&offset,this->chainWiggle);
    }
    local_40 = FTexture::GetScaledWidth(pFVar4);
    local_44 = (uint)(((double)((local_40 - this->leftPadding) - this->rightPadding) / 100.0) *
                     (double)this->drawValue);
    local_48 = SBarInfoCoordinate::operator+(&this->x,local_44 % this->chainSize);
    local_4c = (SBarInfoCoordinate)offset;
    iVar2 = SBarInfoMainBlock::XOffset(block);
    iVar3 = SBarInfoMainBlock::YOffset(block);
    dVar5 = SBarInfoMainBlock::Alpha(block);
    bVar1 = SBarInfoMainBlock::FullScreenOffsets(block);
    DSBarInfo::DrawGraphic
              (statusBar,pFVar4,local_48,local_4c,iVar2,iVar3,dVar5,bVar1,false,false,0,false,-1,-1,
               nulclip,false);
    pFVar4 = _chainWidth;
    if (_chainWidth != (FTexture *)0x0) {
      local_54 = SBarInfoCoordinate::operator+(&this->x,this->leftPadding);
      local_50 = SBarInfoCoordinate::operator+(&local_54,local_44);
      iVar2 = offset;
      iVar3 = SBarInfoMainBlock::XOffset(block);
      yOffset = SBarInfoMainBlock::YOffset(block);
      dVar5 = SBarInfoMainBlock::Alpha(block);
      bVar1 = SBarInfoMainBlock::FullScreenOffsets(block);
      DSBarInfo::DrawGraphic
                (statusBar,pFVar4,local_50,(SBarInfoCoordinate)iVar2,iVar3,yOffset,dVar5,bVar1,
                 (bool)(this->translatable & 1),false,0,false,-1,-1,nulclip,false);
    }
  }
  return;
}

Assistant:

void	Draw(const SBarInfoMainBlock *block, const DSBarInfo *statusBar)
		{
			FTexture *chainImg = statusBar->Images[chain];
			FTexture *gemImg = statusBar->Images[gem];
			if(chainImg == NULL)
				return;
		
			SBarInfoCoordinate drawY = y;
			if(wiggle && drawValue != goalValue) // Should only wiggle when the value doesn't equal what is being drawn.
				drawY += chainWiggle;
			int chainWidth = chainImg->GetScaledWidth();
			int offset = (int) (((double) (chainWidth-leftPadding-rightPadding)/100)*drawValue);
			statusBar->DrawGraphic(chainImg, x+(offset%chainSize), drawY, block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets());
			if(gemImg != NULL)
				statusBar->DrawGraphic(gemImg, x+leftPadding+offset, drawY, block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets(), translatable);
		}